

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# floatingpoint_tests.cpp
# Opt level: O1

void __thiscall
floatingpoint_test::iu_FloatingpointTest_x_iutest_x_NINF_Test<long_double>::Body
          (iu_FloatingpointTest_x_iutest_x_NINF_Test<long_double> *this)

{
  floating_point<long_double> *in_R9;
  AssertionResult iutest_ar;
  _Myt f;
  allocator<char> local_1f1;
  AssertionResult local_1f0;
  FInt local_1c8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1b8;
  char *local_1a8;
  undefined8 local_1a0;
  undefined1 local_198 [400];
  
  local_198._10_6_ = 0;
  local_198._0_8_ =
       SUB108(-(longdouble)FloatingpointTest<long_double>::ONE._0_10_ /
              (longdouble)FloatingpointTest<long_double>::ZERO._0_10_,0);
  local_198._8_2_ =
       (undefined2)
       ((unkuint10)
        (-(longdouble)FloatingpointTest<long_double>::ONE._0_10_ /
        (longdouble)FloatingpointTest<long_double>::ZERO._0_10_) >> 0x40);
  local_1c8.iv._0_8_ =
       (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
        *)0x8000000000000000;
  local_1c8.iv._8_8_ = 0xffff;
  iutest::internal::
  CmpHelperEQ<iutest::floating_point<long_double>,iutest::floating_point<long_double>>
            (&local_1f0,(internal *)"FloatType(a/b)","FloatType::NINF()",local_198,
             (floating_point<long_double> *)&local_1c8,in_R9);
  if (local_1f0.m_result == false) {
    memset((iu_global_format_stringstream *)local_198,0,0x188);
    iutest::iu_global_format_stringstream::iu_global_format_stringstream
              ((iu_global_format_stringstream *)local_198);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_1c8,local_1f0.m_message._M_dataplus._M_p,&local_1f1);
    local_1a8 = 
    "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/floatingpoint_tests.cpp"
    ;
    local_1a0 = 0x100000050;
    iutest::AssertionHelper::OnFixed((AssertionHelper *)&local_1c8,(Fixed *)local_198,false);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1c8.iv._0_8_ != &local_1b8) {
      operator_delete((void *)local_1c8.iv._0_8_,local_1b8._M_allocated_capacity + 1);
    }
    std::__cxx11::stringstream::~stringstream((stringstream *)local_198);
    std::ios_base::~ios_base((ios_base *)(local_198 + 0x80));
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1f0.m_message._M_dataplus._M_p != &local_1f0.m_message.field_2) {
    operator_delete(local_1f0.m_message._M_dataplus._M_p,
                    local_1f0.m_message.field_2._M_allocated_capacity + 1);
  }
  return;
}

Assistant:

IUTEST_TYPED_TEST(FloatingpointTest, NINF)
{
    typedef typename TestFixture::ftype FloatType;
    TypeParam a= - TestFixture::ONE;
    TypeParam b=TestFixture::ZERO;
    IUTEST_EXPECT_EQ(FloatType(a/b), FloatType::NINF());
}